

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool __thiscall
google::protobuf::DescriptorBuilder::AddSymbol
          (DescriptorBuilder *this,string *full_name,void *parent,string *name,Message *proto,
          Symbol symbol)

{
  Symbol symbol_00;
  bool bVar1;
  long in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  long in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  Symbol SVar2;
  size_type dot_pos;
  FileDescriptor *other_file;
  LogMessage *in_stack_fffffffffffffd48;
  LogMessage *in_stack_fffffffffffffd50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd58;
  Tables *in_stack_fffffffffffffd60;
  void *in_stack_fffffffffffffd68;
  FileDescriptorTables *in_stack_fffffffffffffd70;
  Tables *in_stack_fffffffffffffd78;
  anon_union_8_8_13f84498_for_Symbol_2 in_stack_fffffffffffffd80;
  anon_union_8_8_13f84498_for_Symbol_2 in_stack_fffffffffffffd88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd90;
  char *in_stack_fffffffffffffd98;
  string local_238 [32];
  string local_218 [32];
  string local_1f8 [24];
  string *in_stack_fffffffffffffe20;
  string local_1d8 [4];
  ErrorLocation in_stack_fffffffffffffe2c;
  Message *in_stack_fffffffffffffe30;
  string *in_stack_fffffffffffffe38;
  DescriptorBuilder *in_stack_fffffffffffffe40;
  string local_1b8 [32];
  string local_198 [32];
  string local_178 [32];
  string local_158 [32];
  string local_138 [32];
  string local_118 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  string local_d8 [32];
  long local_b8;
  Type local_b0;
  anon_union_8_8_13f84498_for_Symbol_2 local_a8;
  FileDescriptor *local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  long local_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  bool local_1;
  
  local_20 = in_RDX;
  if (in_RDX == 0) {
    local_20 = *(long *)(in_RDI + 0x58);
  }
  SVar2.field_1.descriptor = in_stack_fffffffffffffd88.descriptor;
  SVar2._0_8_ = in_stack_fffffffffffffd80.descriptor;
  local_30 = in_R8;
  local_18 = in_RSI;
  bVar1 = DescriptorPool::Tables::AddSymbol
                    (in_stack_fffffffffffffd78,(string *)in_stack_fffffffffffffd70,SVar2);
  if (bVar1) {
    symbol_00.field_1.descriptor = in_stack_fffffffffffffd80.descriptor;
    symbol_00._0_8_ = in_stack_fffffffffffffd78;
    bVar1 = FileDescriptorTables::AddAliasUnderParent
                      (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
                       (string *)in_stack_fffffffffffffd60,symbol_00);
    if (bVar1) {
      local_1 = true;
    }
    else {
      if ((*(byte *)(in_RDI + 0x30) & 1) == 0) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)in_stack_fffffffffffffd60,
                   (LogLevel_conflict)((ulong)in_stack_fffffffffffffd58 >> 0x20),
                   (char *)in_stack_fffffffffffffd50,(int)((ulong)in_stack_fffffffffffffd48 >> 0x20)
                  );
        internal::LogMessage::operator<<
                  (in_stack_fffffffffffffd50,(char *)in_stack_fffffffffffffd48);
        internal::LogMessage::operator<<
                  (in_stack_fffffffffffffd50,(string *)in_stack_fffffffffffffd48);
        internal::LogMessage::operator<<
                  (in_stack_fffffffffffffd50,(char *)in_stack_fffffffffffffd48);
        internal::LogFinisher::operator=
                  ((LogFinisher *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
        internal::LogMessage::~LogMessage((LogMessage *)0x4c1b2c);
      }
      local_1 = false;
    }
  }
  else {
    SVar2 = DescriptorPool::Tables::FindSymbol(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
    local_a8 = SVar2.field_1;
    local_b0 = SVar2.type;
    local_a0 = Symbol::GetFile((Symbol *)in_stack_fffffffffffffd58);
    if (local_a0 == *(FileDescriptor **)(in_RDI + 0x58)) {
      local_b8 = std::__cxx11::string::find_last_of((char)local_18,0x2e);
      if (local_b8 == -1) {
        std::operator+(in_stack_fffffffffffffd98,&local_f8);
        std::operator+(in_stack_fffffffffffffd58,(char *)in_stack_fffffffffffffd50);
        AddError(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                 in_stack_fffffffffffffe2c,in_stack_fffffffffffffe20);
        std::__cxx11::string::~string(local_d8);
        std::__cxx11::string::~string((string *)&local_f8);
      }
      else {
        std::__cxx11::string::substr((ulong)local_198,(ulong)local_18);
        std::operator+((char *)in_stack_fffffffffffffd58,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffd50);
        std::operator+(in_stack_fffffffffffffd58,(char *)in_stack_fffffffffffffd50);
        std::__cxx11::string::substr((ulong)local_1b8,(ulong)local_18);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffd88.descriptor,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffd80.descriptor);
        std::operator+(in_stack_fffffffffffffd58,(char *)in_stack_fffffffffffffd50);
        AddError(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                 in_stack_fffffffffffffe2c,in_stack_fffffffffffffe20);
        std::__cxx11::string::~string(local_118);
        std::__cxx11::string::~string(local_138);
        std::__cxx11::string::~string(local_1b8);
        std::__cxx11::string::~string(local_158);
        std::__cxx11::string::~string(local_178);
        std::__cxx11::string::~string(local_198);
      }
    }
    else {
      std::operator+(in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
      std::operator+(local_30,(char *)local_18);
      FileDescriptor::name_abi_cxx11_(local_a0);
      std::operator+(local_30,local_18);
      std::operator+(local_30,(char *)local_18);
      AddError(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
               in_stack_fffffffffffffe2c,in_stack_fffffffffffffe20);
      std::__cxx11::string::~string(local_1d8);
      std::__cxx11::string::~string(local_1f8);
      std::__cxx11::string::~string(local_218);
      std::__cxx11::string::~string(local_238);
    }
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool DescriptorBuilder::AddSymbol(const std::string& full_name,
                                  const void* parent, const std::string& name,
                                  const Message& proto, Symbol symbol) {
  // If the caller passed nullptr for the parent, the symbol is at file scope.
  // Use its file as the parent instead.
  if (parent == nullptr) parent = file_;

  if (tables_->AddSymbol(full_name, symbol)) {
    if (!file_tables_->AddAliasUnderParent(parent, name, symbol)) {
      // This is only possible if there was already an error adding something of
      // the same name.
      if (!had_errors_) {
        GOOGLE_LOG(DFATAL) << "\"" << full_name
                    << "\" not previously defined in "
                       "symbols_by_name_, but was defined in "
                       "symbols_by_parent_; this shouldn't be possible.";
      }
      return false;
    }
    return true;
  } else {
    const FileDescriptor* other_file = tables_->FindSymbol(full_name).GetFile();
    if (other_file == file_) {
      std::string::size_type dot_pos = full_name.find_last_of('.');
      if (dot_pos == std::string::npos) {
        AddError(full_name, proto, DescriptorPool::ErrorCollector::NAME,
                 "\"" + full_name + "\" is already defined.");
      } else {
        AddError(full_name, proto, DescriptorPool::ErrorCollector::NAME,
                 "\"" + full_name.substr(dot_pos + 1) +
                     "\" is already defined in \"" +
                     full_name.substr(0, dot_pos) + "\".");
      }
    } else {
      // Symbol seems to have been defined in a different file.
      AddError(full_name, proto, DescriptorPool::ErrorCollector::NAME,
               "\"" + full_name + "\" is already defined in file \"" +
                   other_file->name() + "\".");
    }
    return false;
  }
}